

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

longlong __thiscall ExactFloat::ToInteger<long_long>(ExactFloat *this,RoundingMode mode)

{
  BigNum a;
  int extraout_EAX;
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  double __x;
  ExactFloat r;
  ExactFloat local_28;
  S2LogMessage local_18;
  
  RoundToPowerOf2(&local_28,(int)this,kRoundTiesToEven);
  if (local_28.bn_exp_ == 0x7ffffffd) {
    lVar5 = 0;
    goto LAB_0023945b;
  }
  lVar5 = 0x7fffffffffffffff;
  if (local_28.bn_exp_ != 0x7ffffffe) {
    if (local_28.bn_exp_ == 0x7fffffff) goto LAB_0023945b;
    exp(&local_28,__x);
    a.bn_ = local_28.bn_.bn_;
    if (extraout_EAX < 0x40) {
      iVar1 = BN_num_bits((BIGNUM *)local_28.bn_.bn_);
      iVar2 = iVar1 + 0xe;
      if (-1 < iVar1 + 7) {
        iVar2 = iVar1 + 7;
      }
      if (8 < (uint)(iVar2 >> 3)) {
        S2LogMessage::S2LogMessage
                  (&local_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                   ,99,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_18.stream_,"Check failed: (((BN_num_bits(bn)+7)/8)) <= (sizeof(uint64)) ",
                   0x3c);
        abort();
      }
      uVar3 = BN_get_word((BIGNUM *)a.bn_);
      lVar4 = uVar3 << ((byte)local_28.bn_exp_ & 0x3f);
      lVar5 = -lVar4;
      if (-1 < local_28.sign_) {
        lVar5 = lVar4;
      }
      goto LAB_0023945b;
    }
  }
  if (local_28.sign_ < 0) {
    lVar5 = -0x8000000000000000;
  }
LAB_0023945b:
  BN_free((BIGNUM *)local_28.bn_.bn_);
  return lVar5;
}

Assistant:

T ExactFloat::ToInteger(RoundingMode mode) const {
  using std::numeric_limits;
  static_assert(sizeof(T) <= sizeof(uint64), "max 64 bits supported");
  static_assert(numeric_limits<T>::is_signed, "only signed types supported");
  const int64 kMinValue = numeric_limits<T>::min();
  const int64 kMaxValue = numeric_limits<T>::max();

  ExactFloat r = RoundToPowerOf2(0, mode);
  if (r.is_nan()) return kMaxValue;
  if (r.is_zero()) return 0;
  if (!r.is_inf()) {
    // If the unsigned value has more than 63 bits it is always clamped.
    if (r.exp() < 64) {
      int64 value = BN_ext_get_uint64(r.bn_.get()) << r.bn_exp_;
      if (r.sign_ < 0) value = -value;
      return max(kMinValue, min(kMaxValue, value));
    }
  }
  return (r.sign_ < 0) ? kMinValue : kMaxValue;
}